

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::FragmentShader::FragmentShader
          (FragmentShader *this,int drawBufferNdx,DrawBufferInfo *info)

{
  TextureChannelClass TVar1;
  reference pvVar2;
  TextureFormat *pTVar3;
  reference pvVar4;
  DrawBufferInfo *info_local;
  int drawBufferNdx_local;
  FragmentShader *this_local;
  
  rr::FragmentShader::FragmentShader(&this->super_FragmentShader,1,1);
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_011d08b0;
  this->m_drawBufferNdx = drawBufferNdx;
  DrawBufferInfo::DrawBufferInfo(&this->m_info,info);
  pvVar2 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::operator[]
                     (&(this->super_FragmentShader).m_inputs,0);
  pvVar2->type = GENERICVECTYPE_FLOAT;
  pTVar3 = DrawBufferInfo::getFormat(&this->m_info);
  TVar1 = tcu::getTextureChannelClass(pTVar3->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    pvVar4 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::
             operator[](&(this->super_FragmentShader).m_outputs,0);
    pvVar4->type = GENERICVECTYPE_FLOAT;
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    pvVar4 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::
             operator[](&(this->super_FragmentShader).m_outputs,0);
    pvVar4->type = GENERICVECTYPE_INT32;
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    pvVar4 = std::vector<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>::
             operator[](&(this->super_FragmentShader).m_outputs,0);
    pvVar4->type = GENERICVECTYPE_UINT32;
  }
  return;
}

Assistant:

FragmentShader::FragmentShader (int drawBufferNdx, const DrawBufferInfo& info)
	: rr::FragmentShader	(1, 1)
	, m_drawBufferNdx		(drawBufferNdx)
	, m_info				(info)
{
	m_inputs[0].type = rr::GENERICVECTYPE_FLOAT;

	switch (tcu::getTextureChannelClass(m_info.getFormat().type))
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			m_outputs[0].type = rr::GENERICVECTYPE_FLOAT;
			break;

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			m_outputs[0].type = rr::GENERICVECTYPE_UINT32;
			break;

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			m_outputs[0].type = rr::GENERICVECTYPE_INT32;
			break;

		default:
			DE_ASSERT(false);
	};
}